

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

bool __thiscall
cornerstone::raft_server::replicate_log
          (raft_server *this,bufptr *log,ptr<void> *cookie,uint cookie_tag)

{
  element_type *peVar1;
  bool bVar2;
  ptr<log_entry> entry;
  log_entry *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_30;
  _Tuple_impl<1UL,_void_(*)(cornerstone::buffer_*)> local_28;
  
  bVar2 = is_leader(this);
  if (bVar2) {
    local_28.super__Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>._M_head_impl =
         (_Head_base<1UL,_void_(*)(cornerstone::buffer_*),_false>)
         ((this->state_).super___shared_ptr<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->term_;
    std::
    make_shared<cornerstone::log_entry,unsigned_long,std::unique_ptr<cornerstone::buffer,void(*)(cornerstone::buffer*)>>
              ((unsigned_long *)&local_38,
               (unique_ptr<cornerstone::buffer,_void_(*)(cornerstone::buffer_*)> *)&local_28);
    if ((cookie->super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>)._M_ptr != (element_type *)0x0
       ) {
      log_entry::set_cookie(local_38,cookie_tag,cookie);
    }
    peVar1 = (this->log_store_).
             super___shared_ptr<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*peVar1->_vptr_log_store[5])(peVar1,&local_38);
    std::recursive_mutex::lock(&this->lock_);
    request_append_entries(this);
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock_);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30);
  }
  return false;
}

Assistant:

bool raft_server::replicate_log(bufptr& log, const ptr<void>& cookie, uint cookie_tag)
{
    if (!is_leader())
    {
        return false;
    }

    ptr<log_entry> entry = cs_new<log_entry>(state_->get_term(), std::move(log));
    if (cookie)
    {
        entry->set_cookie(cookie_tag, cookie);
    }

    log_store_->append(entry);
    {
        recur_lock(lock_);
        request_append_entries();
    }

    return false;
}